

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O1

XXH_INLINE_XXH128_hash_t XXH_INLINE_XXH128(void *input,size_t len,XXH64_hash_t seed)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  XXH_INLINE_XXH128_hash_t XVar6;
  XXH_INLINE_XXH128_hash_t XVar7;
  ulong uVar8;
  xxh_u8 *in_RCX;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  xxh_u8 *pxVar14;
  xxh_u8 *pxVar15;
  undefined1 auVar16 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  XXH_INLINE_XXH128_hash_t acc;
  XXH_INLINE_XXH128_hash_t acc_00;
  XXH_INLINE_XXH128_hash_t acc_01;
  XXH_INLINE_XXH128_hash_t acc_02;
  XXH_INLINE_XXH128_hash_t XVar23;
  XXH_INLINE_XXH128_hash_t acc_03;
  xxh_u8 local_f0 [192];
  undefined1 auVar17 [32];
  
  if (0x10 < len) {
    if (len < 0x81) {
      acc_03.low64 = len * -0x61c8864e7a143579;
      if (len < 0x21) {
        acc_02.high64 = 0;
        acc_02.low64 = acc_03.low64;
      }
      else {
        if (len < 0x41) {
          acc_01.high64 = 0;
          acc_01.low64 = acc_03.low64;
        }
        else {
          if (len < 0x61) {
            acc.high64 = 0;
            acc.low64 = acc_03.low64;
          }
          else {
            acc_03.high64 = 0;
            acc = XXH128_mix32B(acc_03,(xxh_u8 *)((long)input + 0x30),
                                (xxh_u8 *)((long)input + (len - 0x40)),kSecret + 0x60,seed);
          }
          acc_01 = XXH128_mix32B(acc,(xxh_u8 *)((long)input + 0x20),
                                 (xxh_u8 *)((long)input + (len - 0x30)),kSecret + 0x40,seed);
        }
        acc_02 = XXH128_mix32B(acc_01,(xxh_u8 *)((long)input + 0x10),
                               (xxh_u8 *)((long)input + (len - 0x20)),kSecret + 0x20,seed);
      }
      XVar23 = XXH128_mix32B(acc_02,(xxh_u8 *)input,(xxh_u8 *)((long)input + (len - 0x10)),kSecret,
                             seed);
      uVar8 = XVar23.low64 + XVar23.high64;
      uVar13 = (len - seed) * -0x3d4d51c2d82b14b1 + XVar23.high64 * -0x7a1435883d4d519d +
               XVar23.low64 * -0x61c8864e7a143579;
      uVar8 = (uVar8 >> 0x25 ^ uVar8) * 0x165667919e3779f9;
      uVar8 = uVar8 >> 0x20 ^ uVar8;
      uVar13 = (uVar13 >> 0x25 ^ uVar13) * 0x165667919e3779f9;
      uVar13 = uVar13 >> 0x20 ^ uVar13;
    }
    else {
      if (0xf0 < len) {
        if (seed == 0) {
          pxVar15 = kSecret;
        }
        else {
          auVar16 = vpbroadcastq_avx512vl();
          auVar1 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          lVar11 = 0xc;
          auVar20._8_8_ = 0xc;
          auVar20._0_8_ = 0xc;
          auVar20._16_8_ = 0xc;
          auVar20._24_8_ = 0xc;
          in_RCX = kSecret;
          pxVar15 = local_f0;
          auVar21._8_8_ = 4;
          auVar21._0_8_ = 4;
          auVar21._16_8_ = 4;
          auVar21._24_8_ = 4;
          do {
            uVar8 = vpcmpuq_avx512vl(auVar1,auVar20,1);
            uVar8 = uVar8 & 0xf;
            auVar22 = vpsllq_avx2(auVar1,4);
            auVar17 = vpgatherqq_avx512vl(0xbe4ba423396cfeb8);
            auVar18._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar17._8_8_;
            auVar18._0_8_ = (ulong)((byte)uVar8 & 1) * auVar17._0_8_;
            auVar18._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar17._16_8_;
            auVar18._24_8_ = (uVar8 >> 3) * auVar17._24_8_;
            auVar17 = vpaddq_avx2(auVar18,auVar16);
            vpscatterqq_avx512vl(ZEXT832(pxVar15) + auVar22,uVar8,auVar17);
            auVar17 = vpgatherqq_avx512vl(0x1cad21f72c81017c);
            auVar19._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar17._8_8_;
            auVar19._0_8_ = (ulong)((byte)uVar8 & 1) * auVar17._0_8_;
            auVar19._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar17._16_8_;
            auVar19._24_8_ = (uVar8 >> 3) * auVar17._24_8_;
            auVar17 = vpsubq_avx2(auVar19,auVar16);
            vpscatterqq_avx512vl(ZEXT832(pxVar15) + ZEXT832(8) + auVar22,uVar8,auVar17);
            auVar1 = vpaddq_avx2(auVar1,auVar21);
            lVar11 = lVar11 + -4;
          } while (lVar11 != 0);
        }
        XVar23 = XXH3_hashLong_128b_internal((xxh_u8 *)input,len,pxVar15,(size_t)in_RCX);
        return XVar23;
      }
      lVar11 = 4;
      pxVar14 = kSecret;
      XVar23.high64 = 0;
      XVar23.low64 = len * -0x61c8864e7a143579;
      pxVar15 = (xxh_u8 *)input;
      do {
        XVar23 = XXH128_mix32B(XVar23,pxVar15,pxVar15 + 0x10,pxVar14,seed);
        pxVar14 = pxVar14 + 0x20;
        pxVar15 = pxVar15 + 0x20;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      uVar8 = (XVar23.low64 >> 0x25 ^ XVar23.low64) * 0x165667919e3779f9;
      uVar13 = (XVar23.high64 >> 0x25 ^ XVar23.high64) * 0x165667919e3779f9;
      acc_00.high64 = uVar13 >> 0x20 ^ uVar13;
      acc_00.low64 = uVar8 >> 0x20 ^ uVar8;
      if (0x9f < len) {
        uVar9 = (uint)(len >> 5) & 0x7ffffff;
        uVar8 = 5;
        if (5 < uVar9) {
          uVar8 = (ulong)uVar9;
        }
        lVar11 = uVar8 - 4;
        pxVar15 = (xxh_u8 *)((long)input + 0x80);
        pxVar14 = kSecret + 3;
        do {
          acc_00 = XXH128_mix32B(acc_00,pxVar15,pxVar15 + 0x10,pxVar14,seed);
          pxVar14 = pxVar14 + 0x20;
          pxVar15 = pxVar15 + 0x20;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      XVar23 = XXH128_mix32B(acc_00,(xxh_u8 *)((long)input + (len - 0x10)),
                             (xxh_u8 *)((long)input + (len - 0x20)),kSecret + 0x67,-seed);
      uVar8 = XVar23.low64 + XVar23.high64;
      uVar13 = (len - seed) * -0x3d4d51c2d82b14b1 + XVar23.high64 * -0x7a1435883d4d519d +
               XVar23.low64 * -0x61c8864e7a143579;
      uVar8 = (uVar8 >> 0x25 ^ uVar8) * 0x165667919e3779f9;
      uVar8 = uVar8 >> 0x20 ^ uVar8;
      uVar13 = (uVar13 >> 0x25 ^ uVar13) * 0x165667919e3779f9;
      uVar13 = uVar13 >> 0x20 ^ uVar13;
    }
    XVar7.high64 = -uVar13;
    XVar7.low64 = uVar8;
    return XVar7;
  }
  if (len < 9) {
    if (3 < len) {
      uVar9 = (uint)seed;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = ((ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                             uVar9 << 0x18) << 0x20 ^ seed) + 0xc4f023344dc994ac ^
                     CONCAT44(*(undefined4 *)((long)input + (len - 4)),*input);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = len * 4 + 0x9e3779b185ebca87;
      uVar13 = SUB168(auVar4 * auVar5,0);
      uVar8 = SUB168(auVar4 * auVar5,8) + uVar13 * 2;
      uVar13 = uVar8 >> 3 ^ uVar13;
      uVar13 = (uVar13 >> 0x23 ^ uVar13) * -0x604de39ae16720db;
      uVar13 = uVar13 >> 0x1c ^ uVar13;
      goto LAB_00109dd7;
    }
    if (len == 0) {
      uVar8 = seed + 0x9e3779b185ebca87 ^ 0x682e908a3037f8b4;
      uVar13 = (uVar8 >> 0x25 ^ uVar8) * 0x165667919e3779f9;
      uVar13 = uVar13 >> 0x20 ^ uVar13;
      uVar8 = 0xc2b2ae3d27d4eb4f - seed ^ 0x9655d30bd1a77d49;
      goto LAB_00109dd7;
    }
    uVar9 = (int)len << 8;
    uVar10 = uVar9 | (uint)*input << 0x10 | (uint)*(byte *)((long)input + (len >> 1)) << 0x18;
    uVar12 = (uint)*(byte *)((long)input + (len - 1));
    uVar9 = uVar10 >> 0x18 | (uVar9 & 0xff0000 | (uint)*input << 0x10) >> 8 | (uVar9 & 0xff00) << 8;
    uVar13 = ((ulong)(uVar10 | uVar12) ^ seed + 0x87275a9b) * -0x61c8864e7a143579;
    uVar8 = ((ulong)((uVar9 | uVar12 << 0x18) >> 0x13 | uVar9 << 0xd) ^ 0x302c208b - seed) *
            0x27d4eb2f165667c5;
    uVar13 = uVar13 >> 0x25 ^ uVar13;
  }
  else {
    uVar8 = *(ulong *)((long)input + (len - 8));
    auVar2._8_8_ = 0;
    auVar2._0_8_ = 0x59973f0033362349 - seed ^ *input ^ uVar8;
    uVar8 = seed + 0xc202797692d63d58 ^ uVar8;
    uVar8 = (uVar8 & 0xffffffff) * 0x85ebca76 + uVar8 +
            SUB168(auVar2 * ZEXT816(0x9e3779b185ebca87),8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^
                   (len << 0x36) + -0x40000000000000 +
                   SUB168(auVar2 * ZEXT816(0x9e3779b185ebca87),0);
    uVar13 = SUB168(auVar3 * ZEXT816(0xc2b2ae3d27d4eb4f),0);
    uVar8 = uVar8 * -0x3d4d51c2d82b14b1 + SUB168(auVar3 * ZEXT816(0xc2b2ae3d27d4eb4f),8);
    uVar13 = uVar13 >> 0x25 ^ uVar13;
  }
  uVar13 = uVar13 * 0x165667919e3779f9 >> 0x20 ^ uVar13 * 0x165667919e3779f9;
LAB_00109dd7:
  uVar8 = (uVar8 >> 0x25 ^ uVar8) * 0x165667919e3779f9;
  XVar6.high64 = uVar8 >> 0x20 ^ uVar8;
  XVar6.low64 = uVar13;
  return XVar6;
}

Assistant:

XXH_PUBLIC_API XXH128_hash_t
XXH128(const void* input, size_t len, XXH64_hash_t seed)
{
    return XXH3_128bits_withSeed(input, len, seed);
}